

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall
ON_SimpleArray<ON_2fPoint>::Append(ON_SimpleArray<ON_2fPoint> *this,int count,ON_2fPoint *buffer)

{
  int iVar1;
  ON_2fPoint *__dest;
  int iVar2;
  size_t sz;
  
  if (buffer != (ON_2fPoint *)0x0 && 0 < count) {
    sz = (ulong)(uint)count << 3;
    iVar2 = this->m_count;
    if (this->m_capacity < iVar2 + count) {
      iVar1 = NewCapacity(this);
      iVar2 = this->m_count + count;
      if (iVar2 < iVar1) {
        iVar2 = iVar1;
      }
      __dest = (ON_2fPoint *)0x0;
      if ((this->m_a <= buffer) && (buffer < this->m_a + this->m_capacity)) {
        __dest = (ON_2fPoint *)onmalloc(sz);
        memcpy(__dest,buffer,sz);
        buffer = __dest;
      }
      Reserve(this,(long)iVar2);
      iVar2 = this->m_count;
    }
    else {
      __dest = (ON_2fPoint *)0x0;
    }
    memcpy(this->m_a + iVar2,buffer,sz);
    if (__dest != (ON_2fPoint *)0x0) {
      onfree(__dest);
    }
    this->m_count = this->m_count + count;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( int count, const T* buffer ) 
{
  if ( count > 0 && nullptr != buffer ) 
  {
    const size_t sizeof_buffer = count * sizeof(T);
    void* temp = nullptr;
    if ( count + m_count > m_capacity ) 
    {
      int newcapacity = NewCapacity();
      if ( newcapacity < count + m_count )
        newcapacity = count + m_count;
      if ( buffer >= m_a && buffer < (m_a + m_capacity) )
      {
        // buffer is in the block of memory about to be reallocated
        temp = onmalloc(sizeof_buffer);
        memcpy(temp, buffer, sizeof_buffer);
        buffer = (const T*)temp;
      }
      Reserve( newcapacity );
    }
    memcpy( (void*)(m_a + m_count), (void*)(buffer), sizeof_buffer );
    if (nullptr != temp)
      onfree(temp);
    m_count += count;
  }
}